

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

bool __thiscall
uWS::WebSocketProtocol<true>::consumeContinuation
          (WebSocketProtocol<true> *this,char **src,uint *length,void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  bool bVar9;
  ulong uVar10;
  
  if (*length < this->remainingBytes) {
    uVar7 = (*length & 0xfffffffc) + 4;
    if (uVar7 != 0) {
      pbVar6 = (byte *)*src;
      pbVar8 = pbVar6 + uVar7;
      do {
        *pbVar6 = *pbVar6 ^ this->mask[0];
        pbVar6[1] = pbVar6[1] ^ this->mask[1];
        pbVar6[2] = pbVar6[2] ^ this->mask[2];
        pbVar6[3] = pbVar6[3] ^ this->mask[3];
        pbVar6 = pbVar6 + 4;
      } while (pbVar6 < pbVar8);
    }
    uVar7 = this->remainingBytes - *length;
    this->remainingBytes = uVar7;
    bVar5 = handleFragment(this,*src,(ulong)*length,uVar7,(uint)this->opCode[(byte)this->opStack],
                           this->lastFin != '\0',user);
    if ((!bVar5) && (uVar7 = *length, (uVar7 & 3) != 0)) {
      cVar1 = this->mask[1];
      cVar2 = this->mask[2];
      cVar3 = this->mask[3];
      this->mask[-uVar7 & 3] = this->mask[0];
      this->mask[1 - uVar7 & 3] = cVar1;
      this->mask[(ulong)(-uVar7 & 3) ^ 2] = cVar2;
      this->mask[~uVar7 & 3] = cVar3;
    }
    bVar9 = false;
  }
  else {
    uVar7 = this->remainingBytes & 0xfffffffc;
    if (uVar7 != 0) {
      pbVar8 = (byte *)*src;
      pbVar6 = pbVar8 + uVar7;
      do {
        *pbVar8 = *pbVar8 ^ this->mask[0];
        pbVar8[1] = pbVar8[1] ^ this->mask[1];
        pbVar8[2] = pbVar8[2] ^ this->mask[2];
        pbVar8[3] = pbVar8[3] ^ this->mask[3];
        pbVar8 = pbVar8 + 4;
      } while (pbVar8 < pbVar6);
    }
    uVar4 = this->remainingBytes;
    if ((uVar4 & 3) != 0) {
      uVar10 = 0;
      do {
        (*src)[uVar10 + (long)(int)uVar7] = (*src)[uVar10 + (long)(int)uVar7] ^ this->mask[uVar10];
        uVar10 = uVar10 + 1;
      } while (((ulong)uVar4 & 3) != uVar10);
    }
    bVar9 = false;
    bVar5 = handleFragment(this,*src,(ulong)this->remainingBytes,0,
                           (uint)this->opCode[(byte)this->opStack],this->lastFin != '\0',user);
    if (!bVar5) {
      if (this->lastFin != '\0') {
        this->opStack = this->opStack + -1;
      }
      uVar7 = this->remainingBytes;
      *src = *src + uVar7;
      *length = *length - uVar7;
      this->state = '\0';
      bVar9 = true;
    }
  }
  return bVar9;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }